

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O0

void __thiscall
cppcms::cache_interface::store_frame
          (cache_interface *this,string *key,string *frame,int timeout,bool notriggers)

{
  string *in_RDX;
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R8B;
  cache_interface *this_00;
  hold_ptr<cppcms::cache_interface::_data> local_58;
  context *pcStack_50;
  undefined8 local_48;
  _Rb_tree_color _Stack_40;
  undefined4 uStack_3c;
  _Base_ptr local_38;
  _Base_ptr p_Stack_30;
  byte local_1d;
  
  local_1d = in_R8B & 1;
  local_38 = (_Base_ptr)0x0;
  p_Stack_30 = (_Base_ptr)0x0;
  local_48 = 0;
  _Stack_40 = _S_red;
  uStack_3c = 0;
  local_58.ptr_ = (_data *)0x0;
  pcStack_50 = (context *)0x0;
  this_00 = (cache_interface *)&stack0xffffffffffffffa8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x410d27);
  store_frame(this_00,in_RDX,in_RSI,in_RDI,0,false);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x410d5a);
  return;
}

Assistant:

void cache_interface::store_frame(std::string const &key,
				 std::string const &frame,
				 int timeout,
				 bool notriggers)
{
	store_frame(key,frame,set<std::string>(),timeout,notriggers);
}